

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O1

int get_device_perm_inner(perms_ *perms,char *path,uint *uid,uint *gid,mode_t *perm)

{
  int iVar1;
  size_t __n;
  char *__s2;
  perms_ *ppVar2;
  
  __s2 = perms->name;
  if (__s2 != (char *)0x0) {
    ppVar2 = perms + 1;
    do {
      if (ppVar2[-1].prefix == 0) {
        iVar1 = strcmp(path,__s2);
      }
      else {
        __n = strlen(__s2);
        iVar1 = strncmp(path,__s2,__n);
      }
      if (iVar1 == 0) {
        *uid = ppVar2[-1].uid;
        *gid = ppVar2[-1].gid;
        *perm = ppVar2[-1].perm;
        return 0;
      }
      __s2 = ppVar2->name;
      ppVar2 = ppVar2 + 1;
    } while (__s2 != (char *)0x0);
  }
  return -1;
}

Assistant:

static int get_device_perm_inner(struct perms_ *perms, const char *path,
                                    unsigned *uid, unsigned *gid, mode_t *perm)
{
    int i;
    for(i = 0; perms[i].name; i++) {

        if(perms[i].prefix) {
            if(strncmp(path, perms[i].name, strlen(perms[i].name)))
                continue;
        } else {
            if(strcmp(path, perms[i].name))
                continue;
        }
        *uid = perms[i].uid;
        *gid = perms[i].gid;
        *perm = perms[i].perm;
        return 0;
    }
    return -1;
}